

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlineOpaquePass::HasOpaqueArgsOrReturn(InlineOpaquePass *this,Instruction *callInst)

{
  bool bVar1;
  bool bVar2;
  uint32_t typeId;
  int icnt;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  typeId = Instruction::type_id(callInst);
  bVar1 = IsOpaqueType(this,typeId);
  bVar2 = true;
  if (!bVar1) {
    local_40._M_unused._M_object = &icnt;
    icnt = 0;
    local_28 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
               ::_M_manager;
    local_40._8_8_ = this;
    bVar2 = Instruction::WhileEachInId(callInst,(function<bool_(const_unsigned_int_*)> *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool InlineOpaquePass::HasOpaqueArgsOrReturn(const Instruction* callInst) {
  // Check return type
  if (IsOpaqueType(callInst->type_id())) return true;
  // Check args
  int icnt = 0;
  return !callInst->WhileEachInId([&icnt, this](const uint32_t* iid) {
    if (icnt > 0) {
      const Instruction* argInst = get_def_use_mgr()->GetDef(*iid);
      if (IsOpaqueType(argInst->type_id())) return false;
    }
    ++icnt;
    return true;
  });
}